

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

ssize_t __thiscall
cpp_client::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_cpp_client::Connection_internal_*,_false> _Var1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ostream *poVar5;
  ostream *poVar6;
  long *plVar7;
  undefined1 *extraout_RAX;
  undefined1 *puVar8;
  size_t __n_00;
  ulong uVar9;
  long *plVar10;
  void *__buf_00;
  uint __len;
  undefined4 in_register_00000034;
  ulong uVar11;
  int __flags_00;
  string __str;
  long *local_90;
  void *local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar11 = CONCAT44(in_register_00000034,__fd);
  lVar4 = std::chrono::_V2::system_clock::now();
  uVar9 = lVar4 / 1000000;
  if (this->print_communication_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[",2);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"m",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TO SERVER --> ",0xe);
    std::__cxx11::string::substr((ulong)&local_90,uVar11);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_90,(long)local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", \"sentTime\": ",0xe);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[",2);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"m",1);
    local_70 = (long *)CONCAT71(local_70._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_70,1);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
  }
  _Var1._M_head_impl =
       (this->conn_)._M_t.
       super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
       .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl;
  __n_00 = *(long *)(uVar11 + 8) - 1;
  std::__cxx11::string::substr((ulong)&local_90,uVar11);
  Connection_internal::send(_Var1._M_head_impl,(int)&local_90,__buf_00,__n_00,__flags);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  uVar11 = -uVar9;
  if (0 < (long)uVar9) {
    uVar11 = uVar9;
  }
  __len = 1;
  if (9 < uVar11) {
    uVar9 = uVar11;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_0011ed5a;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_0011ed5a;
      }
      if (uVar9 < 10000) goto LAB_0011ed5a;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_0011ed5a:
  _Var1._M_head_impl =
       (this->conn_)._M_t.
       super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
       .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(lVar4 < -999999) + (char)__len);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50[0] + (lVar4 < -999999),__len,uVar11);
  __flags_00 = 0xe;
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x12fefc);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_60 = *plVar10;
    lStack_58 = plVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar10;
    local_70 = (long *)*plVar7;
  }
  local_68 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_80 = *plVar10;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar10;
    local_90 = (long *)*plVar7;
  }
  local_88 = (void *)plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  Connection_internal::send(_Var1._M_head_impl,(int)&local_90,local_88,(size_t)plVar10,__flags_00);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  puVar8 = local_40;
  if (local_50[0] != puVar8) {
    operator_delete(local_50[0]);
    puVar8 = extraout_RAX;
  }
  return (ssize_t)puVar8;
}

Assistant:

void Connection::send(const std::string& msg)
{
   using namespace std::chrono;
   const auto time = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
   if(print_communication_)
   {
      std::cout << sgr::text_magenta
                << "TO SERVER --> "
                << msg.substr(0, msg.size() - 1)
                << ", \"sentTime\": "
                << time << "}"
                << sgr::reset
                << '\n';
   }
   //cut out the last } and append the time sent
   conn_->send(msg.substr(0, msg.size() - 1));
   conn_->send(R"(, "sentTime": )" + std::to_string(time) + "}\x04");
}